

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

int get_hist_bin_idx(int dx,int dy)

{
  int iVar1;
  int idx;
  int hi_idx;
  int lo_idx;
  int32_t ratio;
  int dy_local;
  int dx_local;
  
  iVar1 = (dy << 0x10) / dx;
  if (iVar1 < -0x11a6e) {
    lo_idx = 0;
    hi_idx = 7;
  }
  else if (iVar1 < -0xc79) {
    lo_idx = 8;
    hi_idx = 0xf;
  }
  else if (iVar1 < 0xe822) {
    lo_idx = 0x10;
    hi_idx = 0x17;
  }
  else {
    lo_idx = 0x18;
    hi_idx = 0x1f;
  }
  idx = lo_idx;
  while( true ) {
    if (hi_idx < idx) {
      return 0x1f;
    }
    if (iVar1 <= get_hist_bin_idx::thresholds[idx]) break;
    idx = idx + 1;
  }
  return idx;
}

Assistant:

static inline int get_hist_bin_idx(int dx, int dy) {
  const int32_t ratio = (dy * (1 << FIX_PREC_BITS)) / dx;

  // Find index by bisection
  static const int thresholds[BINS] = {
    -1334015, -441798, -261605, -183158, -138560, -109331, -88359, -72303,
    -59392,   -48579,  -39272,  -30982,  -23445,  -16400,  -9715,  -3194,
    3227,     9748,    16433,   23478,   31015,   39305,   48611,  59425,
    72336,    88392,   109364,  138593,  183191,  261638,  441831, INT32_MAX
  };

  int lo_idx = 0, hi_idx = BINS - 1;
  // Divide into segments of size 8 gives better performance than binary search
  // here.
  if (ratio <= thresholds[7]) {
    lo_idx = 0;
    hi_idx = 7;
  } else if (ratio <= thresholds[15]) {
    lo_idx = 8;
    hi_idx = 15;
  } else if (ratio <= thresholds[23]) {
    lo_idx = 16;
    hi_idx = 23;
  } else {
    lo_idx = 24;
    hi_idx = 31;
  }

  for (int idx = lo_idx; idx <= hi_idx; idx++) {
    if (ratio <= thresholds[idx]) {
      return idx;
    }
  }
  assert(0 && "No valid histogram bin found!");
  return BINS - 1;
}